

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

void Kit_DsdPrint2_rec(FILE *pFile,Kit_DsdNtk_t *pNtk,int Id)

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  uint uVar3;
  int iVar4;
  int __c;
  Kit_DsdObj_t *pKVar5;
  ulong uVar6;
  
  if (-1 < Id) {
    uVar1 = pNtk->nVars;
    if (Id < (int)((uint)pNtk->nNodes + (uint)uVar1)) {
      if (Id < (int)(uint)uVar1) {
        pKVar5 = (Kit_DsdObj_t *)0x0;
      }
      else {
        pKVar5 = pNtk->pNodes[(long)Id - (ulong)uVar1];
      }
      if (pKVar5 == (Kit_DsdObj_t *)0x0) {
        if ((int)(uint)uVar1 <= Id) {
          __assert_fail("Id < pNtk->nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0xf7,"void Kit_DsdPrint2_rec(FILE *, Kit_DsdNtk_t *, int)");
        }
        iVar4 = Id + 0x61;
      }
      else {
        KVar2 = *pKVar5;
        uVar3 = (uint)KVar2 >> 6 & 7;
        if (uVar3 == 2) {
          if (((uint)KVar2 & 0xfc000000) != 0x4000000) {
            __assert_fail("pObj->nFans == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                          ,0x104,"void Kit_DsdPrint2_rec(FILE *, Kit_DsdNtk_t *, int)");
          }
        }
        else if (uVar3 == 1) {
          if ((uint)KVar2 < 0x4000000) {
            fwrite("Const1",6,1,(FILE *)pFile);
            return;
          }
          __assert_fail("pObj->nFans == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0xfe,"void Kit_DsdPrint2_rec(FILE *, Kit_DsdNtk_t *, int)");
        }
        iVar4 = 0x2a;
        if (uVar3 != 3) {
          iVar4 = (uVar3 != 4) + 0x2b;
        }
        __c = 0x28;
        if (((uint)KVar2 & 0x1c0) == 0x140) {
          __c = 0x5b;
        }
        fputc(__c,(FILE *)pFile);
        KVar2 = *pKVar5;
        if (0x3ffffff < (uint)KVar2) {
          uVar6 = 0;
          do {
            uVar1 = *(ushort *)((long)&pKVar5[1].field_0x0 + uVar6 * 2);
            if ((uVar1 & 1) != 0) {
              fputc(0x21,(FILE *)pFile);
            }
            Kit_DsdPrint2_rec(pFile,pNtk,(uint)(uVar1 >> 1));
            if (uVar6 < ((uint)*pKVar5 >> 0x1a) - 1) {
              fputc(iVar4,(FILE *)pFile);
            }
            uVar6 = uVar6 + 1;
            KVar2 = *pKVar5;
          } while (uVar6 < (uint)KVar2 >> 0x1a);
        }
        if (((uint)KVar2 & 0x1c0) == 0x140) {
          iVar4 = 0x5d;
        }
        else {
          iVar4 = 0x29;
        }
      }
      fputc(iVar4,(FILE *)pFile);
      return;
    }
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

void Kit_DsdPrint2_rec( FILE * pFile, Kit_DsdNtk_t * pNtk, int Id )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i;
    char Symbol;

    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        fprintf( pFile, "%c", 'a' + Id );
        return;
    }

    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        assert( pObj->nFans == 0 );
        fprintf( pFile, "Const1" );
        return;
    }

    if ( pObj->Type == KIT_DSD_VAR )
        assert( pObj->nFans == 1 );

    if ( pObj->Type == KIT_DSD_AND )
        Symbol = '*';
    else if ( pObj->Type == KIT_DSD_XOR )
        Symbol = '+';
    else 
        Symbol = ',';

    if ( pObj->Type == KIT_DSD_PRIME )
        fprintf( pFile, "[" );
    else
        fprintf( pFile, "(" );
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
    {
        if ( Abc_LitIsCompl(iLit) ) 
            fprintf( pFile, "!" );
        Kit_DsdPrint2_rec( pFile, pNtk, Abc_Lit2Var(iLit) );
        if ( i < pObj->nFans - 1 )
            fprintf( pFile, "%c", Symbol );
    }
    if ( pObj->Type == KIT_DSD_PRIME )
        fprintf( pFile, "]" );
    else
        fprintf( pFile, ")" );
}